

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerDirectReadOk(Pager *pPager,Pgno pgno)

{
  long lVar1;
  uint uVar2;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  u32 iRead;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_fffffffffffffff0;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (**(long **)(in_RDI + 0x48) == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = sqlite3PCacheIsDirty(*(PCache **)(in_RDI + 0x120));
    if (iVar3 == 0) {
      if (*(long *)(in_RDI + 0x128) != 0) {
        iVar3 = 0;
        sqlite3WalFindFrame((Wal *)(ulong)in_stack_fffffffffffffff0,(Pgno)((ulong)in_RDI >> 0x20),
                            (u32 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
        if (iVar3 != 0) {
          iVar3 = 0;
          goto LAB_0016d542;
        }
      }
      uVar2 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x60))(*(undefined8 *)(in_RDI + 0x48));
      if ((uVar2 & 0x8000) == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = 1;
      }
    }
    else {
      iVar3 = 0;
    }
  }
LAB_0016d542:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerDirectReadOk(Pager *pPager, Pgno pgno){
  assert( pPager!=0 );
  assert( pPager->fd!=0 );
  if( pPager->fd->pMethods==0 ) return 0;  /* Case (1) */
  if( sqlite3PCacheIsDirty(pPager->pPCache) ) return 0; /* Failed (3) */
#ifndef SQLITE_OMIT_WAL
  if( pPager->pWal ){
    u32 iRead = 0;
    (void)sqlite3WalFindFrame(pPager->pWal, pgno, &iRead);
    if( iRead ) return 0;  /* Case (4) */
  }
#endif
  assert( pPager->fd->pMethods->xDeviceCharacteristics!=0 );
  if( (pPager->fd->pMethods->xDeviceCharacteristics(pPager->fd)
        & SQLITE_IOCAP_SUBPAGE_READ)==0 ){
    return 0; /* Case (2) */
  }
  return 1;
}